

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOrder.c
# Opt level: O2

void Abc_NtkImplementCiOrder(Abc_Ntk_t *pNtk,char *pFileName,int fReverse,int fVerbose)

{
  int iVar1;
  FILE *__stream;
  Vec_Ptr_t *vSupp;
  void **ppvVar2;
  Abc_Obj_t *Entry;
  int iVar3;
  uint uVar4;
  char Buffer [1000];
  
  __stream = fopen(pFileName,"r");
  iVar1 = pNtk->vCis->nSize;
  vSupp = (Vec_Ptr_t *)malloc(0x10);
  iVar3 = 8;
  if (6 < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  vSupp->nSize = 0;
  vSupp->nCap = iVar3;
  if (iVar3 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((long)iVar3 << 3);
  }
  vSupp->pArray = ppvVar2;
  while( true ) {
    iVar1 = __isoc99_fscanf(__stream,"%s",Buffer);
    if (iVar1 != 1) {
      fclose(__stream);
      if (vSupp->nSize == pNtk->vCis->nSize) {
        Abc_NtkChangeCiOrder(pNtk,vSupp,fReverse);
      }
      else {
        printf("The number of names in the order (%d) is not the same as the number of PIs (%d).\n")
        ;
      }
      Vec_PtrFree(vSupp);
      return;
    }
    Entry = Abc_NtkFindCi(pNtk,Buffer);
    if ((Entry == (Abc_Obj_t *)0x0) ||
       ((uVar4 = *(uint *)&Entry->field_0x14 & 0xf, uVar4 != 2 && (uVar4 != 5)))) break;
    Vec_PtrPush(vSupp,Entry);
  }
  printf("Name \"%s\" is not a PI name. Cannot use this order.\n",Buffer);
  Vec_PtrFree(vSupp);
  fclose(__stream);
  return;
}

Assistant:

void Abc_NtkImplementCiOrder( Abc_Ntk_t * pNtk, char * pFileName, int fReverse, int fVerbose )
{
    char Buffer[1000];
    FILE * pFile;
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj;
    pFile = fopen( pFileName, "r" );
    vSupp = Vec_PtrAlloc( Abc_NtkCiNum(pNtk) );
    while ( fscanf( pFile, "%s", Buffer ) == 1 )
    {
        pObj = Abc_NtkFindCi( pNtk, Buffer );
        if ( pObj == NULL || !Abc_ObjIsCi(pObj) )
        {
            printf( "Name \"%s\" is not a PI name. Cannot use this order.\n", Buffer );
            Vec_PtrFree( vSupp );
            fclose( pFile );
            return;
        }
        Vec_PtrPush( vSupp, pObj );
    }
    fclose( pFile );
    if ( Vec_PtrSize(vSupp) != Abc_NtkCiNum(pNtk) )
    {
        printf( "The number of names in the order (%d) is not the same as the number of PIs (%d).\n", Vec_PtrSize(vSupp), Abc_NtkCiNum(pNtk) );
        Vec_PtrFree( vSupp );
        return;
    }
    Abc_NtkChangeCiOrder( pNtk, vSupp, fReverse );
    Vec_PtrFree( vSupp );
}